

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_cmp_cint(MDB_val *a,MDB_val *b)

{
  ushort uVar1;
  ushort *puVar2;
  ushort *puVar3;
  
  puVar2 = (ushort *)((a->mv_size - 2) + (long)b->mv_data);
  puVar3 = (ushort *)((long)a->mv_data + a->mv_size);
  do {
    puVar3 = puVar3 + -1;
    uVar1 = *puVar2;
    if (*puVar3 != uVar1) break;
    puVar2 = puVar2 + -1;
  } while (a->mv_data < puVar3);
  return (uint)*puVar3 - (uint)uVar1;
}

Assistant:

static int
mdb_cmp_cint(const MDB_val *a, const MDB_val *b)
{
#if BYTE_ORDER == LITTLE_ENDIAN
	unsigned short *u, *c;
	int x;

	u = (unsigned short *) ((char *) a->mv_data + a->mv_size);
	c = (unsigned short *) ((char *) b->mv_data + a->mv_size);
	do {
		x = *--u - *--c;
	} while(!x && u > (unsigned short *)a->mv_data);
	return x;
#else
	unsigned short *u, *c, *end;
	int x;

	end = (unsigned short *) ((char *) a->mv_data + a->mv_size);
	u = (unsigned short *)a->mv_data;
	c = (unsigned short *)b->mv_data;
	do {
		x = *u++ - *c++;
	} while(!x && u < end);
	return x;
#endif
}